

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_ALGORITHM_DESCRIPTION_Unmarshal
                 (TPMS_ALGORITHM_DESCRIPTION *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  if (iVar1 < 2) {
    return 0x9a;
  }
  UVar2 = ByteArrayToUint16(*buffer);
  target->alg = UVar2;
  *buffer = *buffer + 2;
  TVar3 = TPMA_ALGORITHM_Unmarshal(&target->attributes,buffer,size);
  return TVar3;
}

Assistant:

TPM_RC
TPMS_ALGORITHM_DESCRIPTION_Unmarshal(TPMS_ALGORITHM_DESCRIPTION *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->alg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_ALGORITHM_Unmarshal((TPMA_ALGORITHM *)&(target->attributes), buffer, size);
    return result;
}